

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg7.c
# Opt level: O0

_Bool borg_enchant_to_h(void)

{
  bool bVar1;
  borg_item *pbVar2;
  _Bool _Var3;
  int iVar4;
  borg_item_conflict *item_2;
  borg_item_conflict *item_1;
  _Bool skip;
  borg_item_conflict *item;
  wchar_t b_a;
  wchar_t s_a;
  wchar_t a;
  wchar_t b_i;
  wchar_t i;
  
  s_a = L'\xffffffff';
  item._0_4_ = 99;
  if ((my_need_enchant_to_h == 0) && (enchant_weapon_swap_to_h == L'\0')) {
    b_i._3_1_ = false;
  }
  else if ((borg_skill[0xd3] == 0) && (borg_skill[0xd5] == 0)) {
    b_i._3_1_ = false;
  }
  else {
    for (a = (wchar_t)z_info->pack_size; pbVar2 = borg_items, a <= (uint)z_info->pack_size + L'\x01'
        ; a = a + L'\x01') {
      if (((borg_items[a].iqty != '\0') && ((borg_items[a].ident & 1U) != 0)) &&
         (borg_items[a].tval != '\x06')) {
        iVar4 = (int)borg_items[a].to_h;
        _Var3 = borg_spell_okay_fail(ENCHANT_WEAPON,L'A');
        if ((_Var3) || (0 < borg_skill[0xd5])) {
          if (iVar4 < borg_cfg[0x1c]) goto LAB_002c6e41;
        }
        else if (iVar4 < 8) {
LAB_002c6e41:
          if ((((a != (uint)z_info->pack_size + L'\x01') || (2 < borg_skill[0x8a])) ||
              ((pbVar2[a].art_idx != '\0' || (pbVar2[a].ego_idx != '\0')))) &&
             ((s_a < L'\0' || (iVar4 <= (int)item)))) {
            s_a = a;
            item._0_4_ = iVar4;
          }
        }
      }
    }
    if (((weapon_swap != L'\0') &&
        (iVar4 = weapon_swap + L'\xffffffff', (borg_items[iVar4].ident & 1U) != 0)) &&
       (borg_items[iVar4].tval != '\x06')) {
      iVar4 = (int)borg_items[iVar4].to_h;
      _Var3 = borg_spell_okay_fail(ENCHANT_WEAPON,L'A');
      if ((_Var3) || (0 < borg_skill[0xd5])) {
        bVar1 = borg_cfg[0x1c] <= iVar4;
      }
      else {
        bVar1 = 7 < iVar4;
      }
      if ((iVar4 < (int)item) && (!bVar1)) {
        s_a = weapon_swap + L'\xffffffff';
        item._0_4_ = iVar4;
      }
    }
    if (s_a < L'\0') {
      for (a = (uint)z_info->pack_size + L'\f';
          a < (int)(z_info->pack_size + 0xc + (uint)z_info->quiver_size); a = a + L'\x01') {
        if ((2 < borg_skill[0x8a]) &&
           ((((borg_items[(int)(z_info->pack_size + 1)].art_idx != '\0' ||
              (borg_items[(int)(z_info->pack_size + 1)].ego_idx != '\0')) &&
             (4 < borg_items[a].iqty)) &&
            (((borg_items[a].ident & 1U) != 0 && ((uint)borg_items[a].tval == borg_skill[0x88]))))))
        {
          iVar4 = (int)borg_items[a].to_h;
          _Var3 = borg_spell_okay_fail(ENCHANT_WEAPON,L'A');
          if ((_Var3) || (0 < borg_skill[0xd5])) {
            if (iVar4 < 10) goto LAB_002c70d7;
          }
          else if (iVar4 < 8) {
LAB_002c70d7:
            if ((s_a < L'\0') || (iVar4 <= (int)item)) {
              s_a = a;
              item._0_4_ = iVar4;
            }
          }
        }
      }
    }
    if (s_a < L'\0') {
      b_i._3_1_ = false;
    }
    else {
      _Var3 = borg_read_scroll(sv_scroll_star_enchant_weapon);
      if (((_Var3) || (_Var3 = borg_read_scroll(sv_scroll_enchant_weapon_to_hit), _Var3)) ||
         (_Var3 = borg_spell_fail(ENCHANT_WEAPON,L'A'), _Var3)) {
        borg_pick_weapon(s_a);
        b_i._3_1_ = true;
      }
      else {
        b_i._3_1_ = false;
      }
    }
  }
  return b_i._3_1_;
}

Assistant:

static bool borg_enchant_to_h(void)
{
    int i, b_i = -1;
    int a, s_a, b_a = 99;

    /* Nothing to enchant */
    if (!my_need_enchant_to_h && !enchant_weapon_swap_to_h)
        return (false);

    /* Need "enchantment" ability */
    if ((!borg_skill[BI_AENCH_TOH]) && (!borg_skill[BI_AENCH_SWEP]))
        return (false);

    /* Look for a weapon that needs enchanting */
    for (i = INVEN_WIELD; i <= INVEN_BOW; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip non-identified items */
        if (!item->ident)
            continue;

        /* Skip my swap digger */
        if (item->tval == TV_DIGGING)
            continue;

        /* Obtain the bonus */
        a = item->to_h;

        /* Skip "boring" items */
        if (borg_spell_okay_fail(ENCHANT_WEAPON, 65)
            || borg_skill[BI_AENCH_SWEP] >= 1) {
            if (a >= borg_cfg[BORG_ENCHANT_LIMIT])
                continue;
        } else {
            if (a >= 8)
                continue;
        }

        /* Most classes store the enchants until they get
         * a 3x shooter (like a long bow).
         * Generally, we do not want the x2 shooter enchanted,
         * since it wastes scrolls.  But if the sword is at +5
         * and the sling at +2, then the sling will be selected
         * because its enchantment is lower.  The borg tries to
         * enchant the least enchanted item.  This will make sure
         * the x2 shooter is skipped and the sword is enchanted,
         * if needed.  If the sword is at +9,+9, and the sling at
         * +0,+0 and the borg has some enchant scrolls, he should
         * store them instead of wasting them on the sling.
         */
        if (i == INVEN_BOW && /* bow */
            borg_skill[BI_AMMO_POWER] < 3 && /* 3x shooter */
            (!item->art_idx && !item->ego_idx)) /* Not artifact or ego */
            continue;

        /* Find the least enchanted item */
        if ((b_i >= 0) && (b_a < a))
            continue;

        /* Save the info */
        b_i = i;
        b_a = a;
    }
    if (weapon_swap) {
        bool skip       = false;
        borg_item* item = &borg_items[weapon_swap - 1];

        /* Skip my swap digger and anything unid'd */
        if (item->ident && item->tval != TV_DIGGING) {
            /* Obtain the bonus */
            s_a = item->to_h;

            /* Skip items that are already enchanted */
            if (borg_spell_okay_fail(ENCHANT_WEAPON, 65)
                || borg_skill[BI_AENCH_SWEP] >= 1) {
                if (s_a >= borg_cfg[BORG_ENCHANT_LIMIT])
                    skip = true;
            } else {
                if (s_a >= 8)
                    skip = true;
            }

            /* Find the least enchanted item */
            if (b_a > s_a && !skip) {
                /* Save the info */
                b_i = weapon_swap - 1;
                b_a = s_a;
            }
        }
    }
    /* Nothing, check ammo */
    if (b_i < 0) {
        /* look through inventory for ammo */
        for (i = QUIVER_START; i < QUIVER_END; i++) {
            borg_item* item = &borg_items[i];

            /* Only enchant ammo if we have a good shooter,
             * otherwise, store the enchants in the home.
             */
            if (borg_skill[BI_AMMO_POWER] < 3
                || (!borg_items[INVEN_BOW].art_idx
                    && !borg_items[INVEN_BOW].ego_idx))
                continue;

            /* Only enchant if qty >= 5 */
            if (item->iqty < 5)
                continue;

            /* Skip non-identified items  */
            if (!item->ident)
                continue;

            /* Make sure it is the right type if missile */
            if (item->tval != borg_skill[BI_AMMO_TVAL])
                continue;

            /* Obtain the bonus  */
            a = item->to_h;

            /* Skip items that are already enchanted */
            if (borg_spell_okay_fail(ENCHANT_WEAPON, 65)
                || borg_skill[BI_AENCH_SWEP] >= 1) {
                if (a >= 10)
                    continue;
            } else {
                if (a >= 8)
                    continue;
            }

            /* Find the least enchanted item */
            if ((b_i >= 0) && (b_a < a))
                continue;

            /* Save the info  */
            b_i = i;
            b_a = a;
        }
    }

    /* Nothing */
    if (b_i < 0)
        return (false);

    /* Enchant it */
    if (borg_read_scroll(sv_scroll_star_enchant_weapon)
        || borg_read_scroll(sv_scroll_enchant_weapon_to_hit)
        || borg_spell_fail(ENCHANT_WEAPON, 65)) {
        borg_pick_weapon(b_i);

        /* Success */
        return (true);
    }

    /* Nothing to do */
    return (false);
}